

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractNumericFacetValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractNumericFacetValidator::~AbstractNumericFacetValidator
          (AbstractNumericFacetValidator *this)

{
  AbstractNumericFacetValidator *this_local;
  
  (this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable =
       (_func_int **)&PTR__AbstractNumericFacetValidator_00533db0;
  if ((((this->fMaxInclusiveInherited & 1U) == 0) && (this->fMaxInclusive != (XMLNumber *)0x0)) &&
     (this->fMaxInclusive != (XMLNumber *)0x0)) {
    (*(this->fMaxInclusive->super_XSerializable)._vptr_XSerializable[1])();
  }
  if ((((this->fMaxExclusiveInherited & 1U) == 0) && (this->fMaxExclusive != (XMLNumber *)0x0)) &&
     (this->fMaxExclusive != (XMLNumber *)0x0)) {
    (*(this->fMaxExclusive->super_XSerializable)._vptr_XSerializable[1])();
  }
  if ((((this->fMinInclusiveInherited & 1U) == 0) && (this->fMinInclusive != (XMLNumber *)0x0)) &&
     (this->fMinInclusive != (XMLNumber *)0x0)) {
    (*(this->fMinInclusive->super_XSerializable)._vptr_XSerializable[1])();
  }
  if ((((this->fMinExclusiveInherited & 1U) == 0) && (this->fMinExclusive != (XMLNumber *)0x0)) &&
     (this->fMinExclusive != (XMLNumber *)0x0)) {
    (*(this->fMinExclusive->super_XSerializable)._vptr_XSerializable[1])();
  }
  if ((((this->fEnumerationInherited & 1U) == 0) &&
      (this->fEnumeration != (RefVectorOf<xercesc_4_0::XMLNumber> *)0x0)) &&
     (this->fEnumeration != (RefVectorOf<xercesc_4_0::XMLNumber> *)0x0)) {
    (*(this->fEnumeration->super_BaseRefVectorOf<xercesc_4_0::XMLNumber>)._vptr_BaseRefVectorOf[1])
              ();
  }
  if ((((this->fEnumerationInherited & 1U) == 0) &&
      (this->fStrEnumeration != (RefArrayVectorOf<char16_t> *)0x0)) &&
     (this->fStrEnumeration != (RefArrayVectorOf<char16_t> *)0x0)) {
    (*(this->fStrEnumeration->super_BaseRefVectorOf<char16_t>)._vptr_BaseRefVectorOf[1])();
  }
  DatatypeValidator::~DatatypeValidator(&this->super_DatatypeValidator);
  return;
}

Assistant:

AbstractNumericFacetValidator::~AbstractNumericFacetValidator()
{
    if (!fMaxInclusiveInherited && fMaxInclusive)
        delete fMaxInclusive;

    if (!fMaxExclusiveInherited && fMaxExclusive)
        delete fMaxExclusive;

    if (!fMinInclusiveInherited && fMinInclusive)
        delete fMinInclusive;

    if (!fMinExclusiveInherited && fMinExclusive)
        delete fMinExclusive;

    //~RefVectorOf will delete all adopted elements
    if (!fEnumerationInherited &&  fEnumeration)
        delete fEnumeration;

    if (!fEnumerationInherited &&  fStrEnumeration)
        delete fStrEnumeration;
}